

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall QtMWidgets::DateTimePicker::wheelEvent(DateTimePicker *this,QWheelEvent *event)

{
  long lVar1;
  int delta;
  DateTimePickerPrivate *pDVar2;
  QPointF local_38;
  
  lVar1 = *(long *)(event + 0x58);
  if (lVar1 != 0) {
    pDVar2 = (this->d).d;
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)event);
    DateTimePickerPrivate::findMovableSection(pDVar2,&local_38);
    if ((int)((ulong)lVar1 >> 0x20) < 1) {
      if (-1 < lVar1) goto LAB_0016bbd1;
      pDVar2 = (this->d).d;
      delta = -(pDVar2->itemHeight + pDVar2->itemTopMargin);
    }
    else {
      pDVar2 = (this->d).d;
      delta = pDVar2->itemTopMargin + pDVar2->itemHeight;
    }
    DateTimePickerPrivate::updateOffset(pDVar2,delta);
    DateTimePickerPrivate::normalizeOffsets((this->d).d);
    DateTimePickerPrivate::clearOffset((this->d).d);
    DateTimePickerPrivate::updateDaysIfNeeded((this->d).d);
    DateTimePickerPrivate::updateCurrentDateTime((this->d).d);
    ((this->d).d)->movableSection = -1;
    QWidget::update();
  }
LAB_0016bbd1:
  event[0xc] = (QWheelEvent)0x1;
  return;
}

Assistant:

void
DateTimePicker::wheelEvent( QWheelEvent * event )
{
	QPoint numDegrees = event->angleDelta();

	if( !numDegrees.isNull() )
	{
		d->findMovableSection( event->position() );

		if( numDegrees.y() > 0 )
			d->updateOffset( d->itemHeight + d->itemTopMargin );
		else if( numDegrees.y() < 0 )
			d->updateOffset( -( d->itemHeight + d->itemTopMargin ) );

		if( numDegrees.y() != 0 )
		{
			d->normalizeOffsets();
			d->clearOffset();
			d->updateDaysIfNeeded();
			d->updateCurrentDateTime();

			d->movableSection = -1;

			update();
		}
	}

	event->accept();
}